

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void wr_chunks(void)

{
  chunk *c_00;
  int local_1c;
  wchar_t i;
  chunk *c;
  wchar_t j;
  
  if ((player->is_dead & 1U) == 0) {
    wr_u16b(chunk_list_max);
    for (c._4_4_ = 0; c._4_4_ < (int)(uint)chunk_list_max; c._4_4_ = c._4_4_ + 1) {
      c_00 = (chunk *)chunk_list[c._4_4_];
      wr_dungeon_aux(c_00);
      wr_objects_aux(c_00);
      wr_monsters_aux(c_00);
      wr_traps_aux(c_00);
      if (((player->opts).opt[0x2a] & 1U) != 0) {
        wr_string(c_00->name);
        wr_s32b(c_00->turn);
        wr_u16b((uint16_t)c_00->depth);
        wr_byte(c_00->feeling);
        wr_u32b(c_00->obj_rating);
        wr_u32b(c_00->mon_rating);
        wr_byte((c_00->good_item & 1U) != 0);
        wr_u16b((uint16_t)c_00->height);
        wr_u16b((uint16_t)c_00->width);
        wr_u16b(c_00->feeling_squares);
        for (local_1c = 0; local_1c < (int)(z_info->f_max + 1); local_1c = local_1c + 1) {
          wr_u16b((uint16_t)c_00->feat_count[local_1c]);
        }
        wr_byte((uint8_t)c_00->ghost->bones_selector);
      }
    }
  }
  return;
}

Assistant:

void wr_chunks(void)
{
	int j;

	if (player->is_dead)
		return;

	wr_u16b(chunk_list_max);

	/* Now write each chunk */
	for (j = 0; j < chunk_list_max; j++) {
		struct chunk *c = chunk_list[j];

		/* Write the terrain and info */
		wr_dungeon_aux(c);

		/* Write the objects */
		wr_objects_aux(c);

		/* Write the monsters */
		wr_monsters_aux(c);

		/* Write the traps */
		wr_traps_aux(c);

		/* Write other chunk info */
		if (OPT(player, birth_levels_persist)) {
			int i;

			wr_string(c->name);
			wr_s32b(c->turn);
			wr_u16b(c->depth);
			wr_byte(c->feeling);
			wr_u32b(c->obj_rating);
			wr_u32b(c->mon_rating);
			wr_byte(c->good_item ? 1 : 0);
			wr_u16b(c->height);
			wr_u16b(c->width);
			wr_u16b(c->feeling_squares);
			for (i = 0; i < z_info->f_max + 1; i++) {
				wr_u16b(c->feat_count[i]);
			}
			wr_byte(c->ghost->bones_selector);
		}
	}
}